

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexical.h
# Opt level: O0

Node * __thiscall
Lexical::variableDesProgram(Node *__return_storage_ptr__,Lexical *this,int *nowProcedure)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  int local_298 [2];
  Node local_290;
  int local_248;
  allocator local_241;
  string local_240 [32];
  Node local_220;
  int local_1d8;
  allocator local_1d1;
  string local_1d0 [32];
  Node local_1b0;
  int local_168;
  allocator local_161;
  string local_160 [32];
  Node local_140;
  int local_f8;
  allocator local_f1;
  string local_f0 [32];
  undefined1 local_d0 [8];
  Node now;
  int local_78 [2];
  undefined1 local_70 [8];
  Node varIdentifier;
  int varIndex;
  int beginIndex;
  int *nowProcedure_local;
  Lexical *this_local;
  
  Generator::pushIndex(&this->generator);
  varIdentifier.to = this->wordIndex;
  iVar2 = this->wordIndex + 1;
  this->wordIndex = iVar2;
  pvVar3 = std::vector<Word,_std::allocator<Word>_>::operator[](&this->words,(long)iVar2);
  bVar1 = std::operator!=(&pvVar3->token,"var");
  if (bVar1) {
    errorParsing(__return_storage_ptr__,this,&varIdentifier.to,this->wordIndex,0x17);
  }
  else {
    varIdentifier.fr = this->wordIndex;
    local_78[1] = 2;
    local_78[0] = 1;
    identifierProgram((Node *)local_70,this,nowProcedure,local_78 + 1,local_78);
    bVar1 = Node::operator==((Node *)local_70,&nullNode);
    if (bVar1) {
      errorParsing(__return_storage_ptr__,this,&varIdentifier.to,-1,-1);
      now.fr = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f0,"varDescription",&local_f1);
      local_f8 = this->nodeCnt;
      this->nodeCnt = local_f8 + 1;
      Node::Node((Node *)local_d0,(string *)local_f0,&local_f8,&varIdentifier.to,&this->wordIndex);
      std::__cxx11::string::~string(local_f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_f1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_160,"var",&local_161);
      local_168 = this->nodeCnt;
      this->nodeCnt = local_168 + 1;
      Node::Node(&local_140,(string *)local_160,&local_168,&varIdentifier.fr,&varIdentifier.fr);
      Node::insertSon((Node *)local_d0,&local_140);
      Node::~Node(&local_140);
      std::__cxx11::string::~string(local_160);
      std::allocator<char>::~allocator((allocator<char> *)&local_161);
      do {
        this->wordIndex = this->wordIndex + 1;
        pvVar3 = std::vector<Word,_std::allocator<Word>_>::operator[]
                           (&this->words,(long)this->wordIndex);
        bVar1 = std::operator==(&pvVar3->token,";");
        if (bVar1) {
          now.son.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ = this->wordIndex;
          Node::insertSon((Node *)local_d0,(Node *)local_70);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1d0,";",&local_1d1);
          local_1d8 = this->nodeCnt;
          this->nodeCnt = local_1d8 + 1;
          Node::Node(&local_1b0,(string *)local_1d0,&local_1d8,&this->wordIndex,&this->wordIndex);
          Node::insertSon((Node *)local_d0,&local_1b0);
          Node::~Node(&local_1b0);
          std::__cxx11::string::~string(local_1d0);
          std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
          searchVariable(this,(Node *)local_d0,nowProcedure);
          Generator::popIndex(&this->generator);
          Node::Node(__return_storage_ptr__,(Node *)local_d0);
          goto LAB_0010ff77;
        }
        pvVar3 = std::vector<Word,_std::allocator<Word>_>::operator[]
                           (&this->words,(long)this->wordIndex);
        bVar1 = std::operator==(&pvVar3->token,",");
        if (!bVar1) {
          errorParsing(__return_storage_ptr__,this,&varIdentifier.to,this->wordIndex,0x18);
          goto LAB_0010ff77;
        }
        now.son.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ = this->wordIndex;
        Node::insertSon((Node *)local_d0,(Node *)local_70);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_240,",",&local_241);
        local_248 = this->nodeCnt;
        this->nodeCnt = local_248 + 1;
        Node::Node(&local_220,(string *)local_240,&local_248,&this->wordIndex,&this->wordIndex);
        Node::insertSon((Node *)local_d0,&local_220);
        Node::~Node(&local_220);
        std::__cxx11::string::~string(local_240);
        std::allocator<char>::~allocator((allocator<char> *)&local_241);
        local_298[1] = 2;
        local_298[0] = 1;
        identifierProgram(&local_290,this,nowProcedure,local_298 + 1,local_298);
        Node::operator=((Node *)local_70,&local_290);
        Node::~Node(&local_290);
        bVar1 = Node::operator==((Node *)local_70,&nullNode);
      } while (!bVar1);
      errorParsing(__return_storage_ptr__,this,&varIdentifier.to,-1,-1);
LAB_0010ff77:
      now.fr = 1;
      Node::~Node((Node *)local_d0);
    }
    Node::~Node((Node *)local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

Node variableDesProgram(const int &nowProcedure) {
		generator.pushIndex();
		int beginIndex = wordIndex;

		if (words[++wordIndex].token != "var") return errorParsing(beginIndex, wordIndex, 23);
		int varIndex = wordIndex;

		Node varIdentifier = identifierProgram(nowProcedure, 2);
		if (varIdentifier == nullNode) return errorParsing(beginIndex);

		Node now = Node("varDescription", nodeCnt++, beginIndex, wordIndex);
		now.insertSon(Node("var", nodeCnt++, varIndex, varIndex));
		while (true) {
			wordIndex++;
			if (words[wordIndex].token == ";") {
				now.to = wordIndex;
				now.insertSon(varIdentifier);
				now.insertSon(Node(";", nodeCnt++, wordIndex, wordIndex));
				searchVariable(now, nowProcedure);

				generator.popIndex();
				return now;
			} else if (words[wordIndex].token == ",") {
				now.to = wordIndex;
				now.insertSon(varIdentifier);
				now.insertSon(Node(",", nodeCnt++, wordIndex, wordIndex));

				varIdentifier = identifierProgram(nowProcedure, 2);
				if (varIdentifier == nullNode) return errorParsing(beginIndex);
			} else return errorParsing(beginIndex, wordIndex, 24); // BASE ERROR
		}
	}